

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  int iVar1;
  void *l;
  global_State *g;
  lua_State *L;
  int i;
  void *ud_local;
  lua_Alloc f_local;
  
  g = (global_State *)(*f)(ud,(void *)0x0,0,0x268);
  if (g == (global_State *)0x0) {
    f_local = (lua_Alloc)0x0;
  }
  else {
    *(undefined8 *)g = 0;
    *(lu_byte *)((long)g + 8) = '\b';
    *(undefined1 *)((long)g + 0xd8) = 0x21;
    *(byte *)((long)g + 9) = *(byte *)((long)g + 0xd8) & 3;
    *(byte *)((long)g + 9) = *(lu_byte *)((long)g + 9) | 0x60;
    preinit_state((lua_State *)g,(global_State *)((long)g + 0xb8));
    *(lua_Alloc *)((long)g + 200) = f;
    (((anon_union_16_2_e895e9e6_for_u *)((long)g + 0xd0))->l).prev = (UpVal *)ud;
    *(global_State **)((long)g + 0x168) = g;
    *(TString **)((long)g + 0x188) = (TString *)((long)g + 0x170);
    *(TString **)((long)g + 400) = (TString *)((long)g + 0x170);
    *(TString **)((long)g + 0x128) = (TString *)0x0;
    *(undefined4 *)((long)g + 0xc4) = 0;
    *(undefined4 *)((long)g + 0xc0) = 0;
    (((global_State *)((long)g + 0xb8))->strt).hash = (GCObject **)0x0;
    ((*(global_State **)((long)g + 0x20))->l_registry).tt = 0;
    *(Table **)((long)g + 0x110) = (Table *)0x0;
    (((TString *)((long)g + 0x120))->tsv).next = (GCObject *)0x0;
    (((TString *)((long)g + 0x150))->tsv).next = (GCObject *)0x0;
    *(undefined1 *)((long)g + 0xd9) = 0;
    *(global_State **)((long)g + 0xe0) = g;
    *(undefined4 *)((long)g + 0xdc) = 0;
    *(Table **)((long)g + 0xe8) = (Table *)((long)g + 0xe0);
    (((TString *)((long)g + 0xf0))->tsv).next = (GCObject *)0x0;
    *(Table **)((long)g + 0xf8) = (Table *)0x0;
    *(Table **)((long)g + 0x100) = (Table *)0x0;
    (((TString *)((long)g + 0x108))->tsv).next = (GCObject *)0x0;
    (((TValue *)((long)g + 0x130))->value).n = 3.04344437838208e-321;
    *(int *)((long)g + 0x148) = 200;
    *(undefined4 *)((long)g + 0x14c) = 200;
    (((TValue *)((long)g + 0x140))->value).gc = (GCObject *)0x0;
    for (L._4_4_ = 0; L._4_4_ < 9; L._4_4_ = L._4_4_ + 1) {
      *(undefined8 *)((long)g + (long)L._4_4_ * 8 + 0x198) = 0;
    }
    iVar1 = luaD_rawrunprotected((lua_State *)g,f_luaopen,(void *)0x0);
    if (iVar1 != 0) {
      close_state((lua_State *)g);
      g = (global_State *)0x0;
    }
    f_local = (lua_Alloc)g;
  }
  return (lua_State *)f_local;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  void *l = (*f)(ud, NULL, 0, state_size(LG));
  if (l == NULL) return NULL;
  L = tostate(l);
  g = &((LG *)L)->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bit2mask(WHITE0BIT, FIXEDBIT);
  L->marked = luaC_white(g);
  set2bits(L->marked, FIXEDBIT, SFIXEDBIT);
  preinit_state(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->uvhead.u.l.prev = &g->uvhead;
  g->uvhead.u.l.next = &g->uvhead;
  g->GCthreshold = 0;  /* mark it as unfinished state */
  g->strt.size = 0;
  g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(registry(L));
  luaZ_initbuffer(L, &g->buff);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->rootgc = obj2gco(L);
  g->sweepstrgc = 0;
  g->sweepgc = &g->rootgc;
  g->gray = NULL;
  g->grayagain = NULL;
  g->weak = NULL;
  g->tmudata = NULL;
  g->totalbytes = sizeof(LG);
  g->gcpause = LUAI_GCPAUSE;
  g->gcstepmul = LUAI_GCMUL;
  g->gcdept = 0;
  for (i=0; i<NUM_TAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != 0) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  else
    luai_userstateopen(L);
  return L;
}